

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void custom_compare_primitive_test(void)

{
  fdb_doc *pfVar1;
  double dVar2;
  fdb_status fVar3;
  size_t sVar4;
  long in_RCX;
  ulong uVar5;
  long lVar6;
  code *__src;
  char *__format;
  fdb_doc **doc;
  double dVar7;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [256];
  fdb_kvs_handle *local_3d8;
  fdb_doc *local_3d0;
  double local_3c8;
  fdb_kvs_handle *local_3c0;
  fdb_file_handle *local_3b8;
  timeval local_3b0;
  fdb_kvs_config local_3a0;
  fdb_doc *local_388 [10];
  double local_338 [33];
  fdb_config local_230;
  char local_138 [264];
  
  uVar5 = 0;
  gettimeofday(&local_3b0,(__timezone_ptr_t)0x0);
  memleak_start();
  local_3d0 = (fdb_doc *)0x0;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_230.buffercache_size = 0;
  local_230.wal_threshold = 0x400;
  local_230.flags = 1;
  local_230.compaction_threshold = '\0';
  local_230.multi_kv_instances = true;
  local_3a0.custom_cmp = _cmp_double;
  fdb_open(&local_3b8,"./dummy1",&local_230);
  fdb_kvs_open_default(local_3b8,&local_3c0,&local_3a0);
  __src = logCallbackFunc;
  fVar3 = fdb_set_log_callback(local_3c0,logCallbackFunc,"custom_compare_primitive_test");
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00114e46;
  doc = local_388;
  lVar6 = 0;
  do {
    dVar7 = 10000.0 / (double)(int)lVar6;
    local_338[0] = dVar7;
    sprintf(local_138,"value: %d, %f",dVar7,uVar5);
    sVar4 = strlen(local_138);
    fdb_doc_create(doc,local_338,8,(void *)0x0,0,local_138,sVar4 + 1);
    fdb_set(local_3c0,*doc);
    lVar6 = lVar6 + 0xb;
    uVar5 = (ulong)((int)uVar5 + 1);
    doc = doc + 1;
  } while (lVar6 != 0x6e);
  in_RCX = 0;
  local_3c8 = dVar7;
  fdb_iterator_init(local_3c0,(fdb_iterator **)&local_3d8,(void *)0x0,0,(void *)0x0,0,0);
  dVar7 = -1.0;
  do {
    __src = (code *)&local_3d0;
    fVar3 = fdb_iterator_get((fdb_iterator *)local_3d8,&local_3d0);
    pfVar1 = local_3d0;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00114e2d:
      custom_compare_primitive_test();
      goto LAB_00114e32;
    }
    __src = (code *)local_3d0->key;
    memcpy(&local_3c8,__src,local_3d0->keylen);
    dVar2 = local_3c8;
    if (local_3c8 <= dVar7) {
      custom_compare_primitive_test();
      goto LAB_00114e2d;
    }
    fdb_doc_free(pfVar1);
    local_3d0 = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_next((fdb_iterator *)local_3d8);
    dVar7 = dVar2;
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close((fdb_iterator *)local_3d8);
  fdb_commit(local_3b8,'\x01');
  in_RCX = 0;
  fdb_iterator_init(local_3c0,(fdb_iterator **)&local_3d8,(void *)0x0,0,(void *)0x0,0,0);
  dVar7 = -1.0;
  do {
    __src = (code *)&local_3d0;
    fVar3 = fdb_iterator_get((fdb_iterator *)local_3d8,&local_3d0);
    pfVar1 = local_3d0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00114e37;
    __src = (code *)local_3d0->key;
    memcpy(&local_3c8,__src,local_3d0->keylen);
    dVar2 = local_3c8;
    if (local_3c8 <= dVar7) goto LAB_00114e32;
    fdb_doc_free(pfVar1);
    local_3d0 = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_next((fdb_iterator *)local_3d8);
    dVar7 = dVar2;
  } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close((fdb_iterator *)local_3d8);
  fdb_compact(local_3b8,"./dummy2");
  in_RCX = 0;
  fdb_iterator_init(local_3c0,(fdb_iterator **)&local_3d8,(void *)0x0,0,(void *)0x0,0,0);
  dVar7 = -1.0;
  while (__src = (code *)&local_3d0, fVar3 = fdb_iterator_get((fdb_iterator *)local_3d8,&local_3d0),
        pfVar1 = local_3d0, fVar3 == FDB_RESULT_SUCCESS) {
    __src = (code *)local_3d0->key;
    memcpy(&local_3c8,__src,local_3d0->keylen);
    dVar2 = local_3c8;
    if (local_3c8 <= dVar7) goto LAB_00114e3c;
    fdb_doc_free(pfVar1);
    local_3d0 = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_next((fdb_iterator *)local_3d8);
    dVar7 = dVar2;
    if (fVar3 == FDB_RESULT_ITERATOR_FAIL) {
      fdb_iterator_close((fdb_iterator *)local_3d8);
      fdb_kvs_close(local_3c0);
      fdb_close(local_3b8);
      lVar6 = 0;
      do {
        fdb_doc_free(local_388[lVar6]);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 10);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (custom_compare_primitive_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"custom compare function for primitive key test");
      return;
    }
  }
  goto LAB_00114e41;
LAB_00114e32:
  custom_compare_primitive_test();
LAB_00114e37:
  custom_compare_primitive_test();
LAB_00114e3c:
  custom_compare_primitive_test();
LAB_00114e41:
  custom_compare_primitive_test();
LAB_00114e46:
  custom_compare_primitive_test();
  if (((fdb_doc **)__src != (fdb_doc **)0x0) && (in_RCX == 0)) {
    return;
  }
  return;
}

Assistant:

void custom_compare_primitive_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], bodybuf[256];
    double key_double, key_double_prev;

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = true;

    kvs_config.custom_cmp = _cmp_double;

    // open db with custom compare function for double key type
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "custom_compare_primitive_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        key_double = 10000/(i*11.0);
        memcpy(keybuf, &key_double, sizeof(key_double));
        sprintf(bodybuf, "value: %d, %f", i, key_double);
        fdb_doc_create(&doc[i], (void*)keybuf, sizeof(key_double), NULL, 0,
            (void*)bodybuf, strlen(bodybuf)+1);
        fdb_set(db, doc[i]);
    }

    // range scan (before flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    key_double_prev = -1;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        memcpy(&key_double, rdoc->key, rdoc->keylen);
        TEST_CHK(key_double > key_double_prev);
        key_double_prev = key_double;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // range scan (after flushing WAL)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    key_double_prev = -1;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        memcpy(&key_double, rdoc->key, rdoc->keylen);
        TEST_CHK(key_double > key_double_prev);
        key_double_prev = key_double;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // range scan (after compaction)
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, 0x0);
    key_double_prev = -1;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        memcpy(&key_double, rdoc->key, rdoc->keylen);
        TEST_CHK(key_double > key_double_prev);
        key_double_prev = key_double;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(iterator);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("custom compare function for primitive key test");
}